

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Iso(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  Abc_Frame_t *pAbc_00;
  int iVar2;
  uint fVerbose;
  Gia_Man_t *pGVar3;
  char *pcVar4;
  char *pcVar5;
  uint fVeryVerbose;
  uint fBetterQual;
  uint local_50;
  uint local_4c;
  Vec_Ptr_t *vPosEquivs;
  Abc_Frame_t *local_38;
  
  local_50 = 0;
  local_38 = pAbc;
  Extra_UtilGetoptReset();
  bVar1 = true;
  fBetterQual = 0;
  local_4c = 0;
  fVerbose = 0;
  fVeryVerbose = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while (iVar2 = Extra_UtilGetopt(argc,argv,"neqdvwh"), pAbc_00 = local_38, iVar2 == 0x77) {
            fVeryVerbose = fVeryVerbose ^ 1;
          }
          if (0x6d < iVar2) break;
          if (iVar2 == -1) {
            pGVar3 = local_38->pGia;
            if (pGVar3 == (Gia_Man_t *)0x0) {
              pcVar4 = "Abc_CommandAbc9Iso(): There is no AIG.\n";
            }
            else if (pGVar3->vCos->nSize - pGVar3->nRegs == 1) {
              pcVar4 = 
              "Abc_CommandAbc9Iso(): The AIG has only one PO. Isomorphism detection is not performed.\n"
              ;
            }
            else {
              if (bVar1) {
                pGVar3 = Gia_ManIsoReduce2(pGVar3,&vPosEquivs,(Vec_Ptr_t **)0x0,local_50,fBetterQual
                                           ,local_4c,fVerbose,fVeryVerbose);
              }
              else {
                pGVar3 = Gia_ManIsoReduce(pGVar3,&vPosEquivs,(Vec_Ptr_t **)0x0,local_50,local_4c,
                                          fVerbose,fVeryVerbose);
              }
              if (pGVar3 != (Gia_Man_t *)0x0) {
                Abc_FrameReplacePoEquivs(pAbc_00,&vPosEquivs);
                Abc_FrameUpdateGia(pAbc_00,pGVar3);
                return 0;
              }
              pcVar4 = "Abc_CommandAbc9Iso(): Transformation has failed.\n";
            }
            iVar2 = -1;
            goto LAB_0028a124;
          }
          if (iVar2 == 100) {
            local_4c = local_4c ^ 1;
          }
          else {
            if (iVar2 != 0x65) goto LAB_00289fac;
            local_50 = local_50 ^ 1;
          }
        }
        if (iVar2 != 0x76) break;
        fVerbose = fVerbose ^ 1;
      }
      if (iVar2 != 0x71) break;
      fBetterQual = fBetterQual ^ 1;
    }
    if (iVar2 != 0x6e) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
LAB_00289fac:
  Abc_Print(-2,"usage: &iso [-neqdvwh]\n");
  Abc_Print(-2,"\t         removes POs with isomorphic sequential COI\n");
  pcVar5 = "yes";
  pcVar4 = "yes";
  if (!bVar1) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-n     : toggle using new fast algorithm [default = %s]\n",pcVar4);
  pcVar4 = "yes";
  if (local_50 == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-e     : toggle computing lower bound on equivalence classes [default = %s]\n",
            pcVar4);
  pcVar4 = "yes";
  if (fBetterQual == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-q     : toggle improving quality at the expense of runtime [default = %s]\n",
            pcVar4);
  pcVar4 = "yes";
  if (local_4c == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-d     : toggle treating the current AIG as a dual-output miter [default = %s]\n",
            pcVar4);
  pcVar4 = "yes";
  if (fVerbose == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
  if (fVeryVerbose == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-w     : toggle printing very verbose information [default = %s]\n",pcVar5);
  pcVar4 = "\t-h     : print the command usage\n";
  iVar2 = -2;
LAB_0028a124:
  Abc_Print(iVar2,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandAbc9Iso( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pAig;
    Vec_Ptr_t * vPosEquivs;
//    Vec_Ptr_t * vPiPerms;
    int c, fNewAlgo = 1, fEstimate = 0, fBetterQual = 0, fDualOut = 0, fVerbose = 0, fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "neqdvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'n':
            fNewAlgo ^= 1;
            break;
        case 'e':
            fEstimate ^= 1;
            break;
        case 'q':
            fBetterQual ^= 1;
            break;
        case 'd':
            fDualOut ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Iso(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManPoNum(pAbc->pGia) == 1 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Iso(): The AIG has only one PO. Isomorphism detection is not performed.\n" );
        return 1;
    }
    if ( fNewAlgo )
        pAig = Gia_ManIsoReduce2( pAbc->pGia, &vPosEquivs, NULL, fEstimate, fBetterQual, fDualOut, fVerbose, fVeryVerbose );
    else
        pAig = Gia_ManIsoReduce( pAbc->pGia, &vPosEquivs, NULL, fEstimate, fDualOut, fVerbose, fVeryVerbose );
//    pAig = Gia_ManIsoReduce( pAbc->pGia, &vPosEquivs, &vPiPerms, 0, fDualOut, fVerbose, fVeryVerbose );
//    Vec_VecFree( (Vec_Vec_t *)vPiPerms );
    if ( pAig == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Iso(): Transformation has failed.\n" );
        return 1;
    }
    // update the internal storage of PO equivalences
    Abc_FrameReplacePoEquivs( pAbc, &vPosEquivs );
    // update the AIG
    Abc_FrameUpdateGia( pAbc, pAig );
    return 0;

usage:
    Abc_Print( -2, "usage: &iso [-neqdvwh]\n" );
    Abc_Print( -2, "\t         removes POs with isomorphic sequential COI\n" );
    Abc_Print( -2, "\t-n     : toggle using new fast algorithm [default = %s]\n", fNewAlgo? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle computing lower bound on equivalence classes [default = %s]\n", fEstimate? "yes": "no" );
    Abc_Print( -2, "\t-q     : toggle improving quality at the expense of runtime [default = %s]\n", fBetterQual? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle treating the current AIG as a dual-output miter [default = %s]\n", fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing very verbose information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}